

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O2

void GPU_MultMatrix(float *A)

{
  float *result;
  
  result = GPU_GetCurrentMatrix();
  if (result != (float *)0x0) {
    GPU_FlushBlitBuffer();
    GPU_MultiplyAndAssign(result,A);
    return;
  }
  return;
}

Assistant:

void GPU_MultMatrix(const float* A)
{
    float* result = GPU_GetCurrentMatrix();
    if(result == NULL)
        return;
	GPU_FlushBlitBuffer();
	// BIG FIXME: All of these matrix stack manipulators should be flushing the blit buffer.
	// A better solution would be to minimize the matrix stack API and make it clear that MultMatrix flushes.
    GPU_MultiplyAndAssign(result, A);
}